

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresultstore.cpp
# Opt level: O0

ResultIteratorBase QtPrivate::findResult(QMap<int,_QtPrivate::ResultItem> *store,int index)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ResultItem *pRVar6;
  int in_ESI;
  long in_FS_OFFSET;
  ResultIteratorBase RVar7;
  int vectorIndex;
  const_iterator it;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  const_iterator in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar8;
  undefined8 local_18;
  undefined4 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QMap<int,_QtPrivate::ResultItem>::isEmpty
                    ((QMap<int,_QtPrivate::ResultItem> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (bVar2) {
    QMap<int,_QtPrivate::ResultItem>::end
              ((QMap<int,_QtPrivate::ResultItem> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    ResultIteratorBase::ResultIteratorBase
              ((ResultIteratorBase *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (const_iterator)in_stack_ffffffffffffff78._M_node,in_stack_ffffffffffffff6c);
  }
  else {
    QMap<int,_QtPrivate::ResultItem>::lowerBound
              ((QMap<int,_QtPrivate::ResultItem> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (int *)in_stack_ffffffffffffff78._M_node);
    QMap<int,_QtPrivate::ResultItem>::end
              ((QMap<int,_QtPrivate::ResultItem> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    bVar2 = ::operator==((const_iterator *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (const_iterator *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (bVar2) {
      QMap<int,_QtPrivate::ResultItem>::const_iterator::operator--
                ((const_iterator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      pRVar6 = QMap<int,_QtPrivate::ResultItem>::const_iterator::value((const_iterator *)0x6e8eb1);
      bVar2 = ResultItem::isVector(pRVar6);
      if (!bVar2) {
        QMap<int,_QtPrivate::ResultItem>::end
                  ((QMap<int,_QtPrivate::ResultItem> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        ResultIteratorBase::ResultIteratorBase
                  ((ResultIteratorBase *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (const_iterator)in_stack_ffffffffffffff78._M_node,in_stack_ffffffffffffff6c);
        goto LAB_006e9029;
      }
    }
    else {
      piVar5 = QMap<int,_QtPrivate::ResultItem>::const_iterator::key((const_iterator *)0x6e8ef7);
      if (in_ESI < *piVar5) {
        QMap<int,_QtPrivate::ResultItem>::begin
                  ((QMap<int,_QtPrivate::ResultItem> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        bVar2 = ::operator==((const_iterator *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             (const_iterator *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (bVar2) {
          QMap<int,_QtPrivate::ResultItem>::end
                    ((QMap<int,_QtPrivate::ResultItem> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          ResultIteratorBase::ResultIteratorBase
                    ((ResultIteratorBase *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (const_iterator)in_stack_ffffffffffffff78._M_node,in_stack_ffffffffffffff6c);
          goto LAB_006e9029;
        }
        QMap<int,_QtPrivate::ResultItem>::const_iterator::operator--
                  ((const_iterator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      }
    }
    piVar5 = QMap<int,_QtPrivate::ResultItem>::const_iterator::key((const_iterator *)0x6e8f69);
    iVar3 = in_ESI - *piVar5;
    iVar8 = iVar3;
    pRVar6 = QMap<int,_QtPrivate::ResultItem>::const_iterator::value((const_iterator *)0x6e8f88);
    iVar4 = ResultItem::count(pRVar6);
    if (iVar8 < iVar4) {
      pRVar6 = QMap<int,_QtPrivate::ResultItem>::const_iterator::value((const_iterator *)0x6e8fc9);
      bVar2 = ResultItem::isVector(pRVar6);
      if ((bVar2) || (iVar3 == 0)) {
        ResultIteratorBase::ResultIteratorBase
                  ((ResultIteratorBase *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (const_iterator)in_stack_ffffffffffffff78._M_node,in_stack_ffffffffffffff6c);
      }
      else {
        QMap<int,_QtPrivate::ResultItem>::end
                  ((QMap<int,_QtPrivate::ResultItem> *)CONCAT44(iVar8,in_ESI));
        ResultIteratorBase::ResultIteratorBase
                  ((ResultIteratorBase *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (const_iterator)in_stack_ffffffffffffff78._M_node,in_stack_ffffffffffffff6c);
      }
    }
    else {
      QMap<int,_QtPrivate::ResultItem>::end
                ((QMap<int,_QtPrivate::ResultItem> *)CONCAT44(iVar8,in_ESI));
      ResultIteratorBase::ResultIteratorBase
                ((ResultIteratorBase *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                 ,(const_iterator)in_stack_ffffffffffffff78._M_node,in_stack_ffffffffffffff6c);
    }
  }
LAB_006e9029:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  RVar7.m_vectorIndex = local_10;
  RVar7.mapIterator.i._M_node = (const_iterator)(const_iterator)local_18;
  RVar7._12_4_ = 0;
  return RVar7;
}

Assistant:

static ResultIteratorBase findResult(const QMap<int, ResultItem> &store, int index)
{
    if (store.isEmpty())
        return ResultIteratorBase(store.end());
    QMap<int, ResultItem>::const_iterator it = store.lowerBound(index);

    // lowerBound returns either an iterator to the result or an iterator
    // to the nearest greater index. If the latter happens it might be
    // that the result is stored in a vector at the previous index.
    if (it == store.end()) {
        --it;
        if (it.value().isVector() == false) {
            return ResultIteratorBase(store.end());
        }
    } else {
        if (it.key() > index) {
            if (it == store.begin())
                return ResultIteratorBase(store.end());
            --it;
        }
    }

    const int vectorIndex = index - it.key();

    if (vectorIndex >= it.value().count())
        return ResultIteratorBase(store.end());
    else if (it.value().isVector() == false && vectorIndex != 0)
        return ResultIteratorBase(store.end());
    return ResultIteratorBase(it, vectorIndex);
}